

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O2

void close_connection(MQTT_CLIENT *mqtt_client)

{
  ulong uVar1;
  bool bVar2;
  
  if ((mqtt_client->mqtt_status & 2) == 0) {
    if (mqtt_client->disconnect_cb != (ON_MQTT_DISCONNECTED_CALLBACK)0x0) {
      (*mqtt_client->disconnect_cb)(mqtt_client->disconnect_ctx);
      return;
    }
  }
  else {
    xio_close(mqtt_client->xioHandle,on_connection_closed,mqtt_client);
    if (mqtt_client->disconnect_cb == (ON_MQTT_DISCONNECTED_CALLBACK)0x0) {
      uVar1 = 0;
      do {
        xio_dowork(mqtt_client->xioHandle);
        ThreadAPI_Sleep(2);
        if ((mqtt_client->mqtt_status & 2) == 0) break;
        bVar2 = uVar1 < 0x13;
        uVar1 = uVar1 + 1;
      } while (bVar2);
    }
    mqtt_client->xioHandle = (XIO_HANDLE)0x0;
  }
  return;
}

Assistant:

static void close_connection(MQTT_CLIENT* mqtt_client)
{
    if (mqtt_client->mqtt_status & MQTT_STATUS_SOCKET_CONNECTED)
    {
        (void)xio_close(mqtt_client->xioHandle, on_connection_closed, mqtt_client);
        if (mqtt_client->disconnect_cb == NULL)
        {
            size_t counter = 0;
            do
            {
                xio_dowork(mqtt_client->xioHandle);
                counter++;
                ThreadAPI_Sleep(2);
            } while (mqtt_client->mqtt_status & MQTT_STATUS_SOCKET_CONNECTED && counter < MAX_CLOSE_RETRIES);
        }
        // Clear the handle because we don't use it anymore
        mqtt_client->xioHandle = NULL;
    }
    else
    {
        mqtt_client->mqtt_status &= ~MQTT_STATUS_SOCKET_CONNECTED;
        if (mqtt_client->disconnect_cb)
        {
            mqtt_client->disconnect_cb(mqtt_client->disconnect_ctx);
        }
    }
}